

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O3

Frag __thiscall re2::Compiler::Plus(Compiler *this,Frag a,bool nongreedy)

{
  uint p;
  undefined8 uVar1;
  Inst *this_00;
  uint32_t out;
  Frag FVar2;
  uint uStack_58;
  uint uStack_54;
  
  p = AllocInst(this,1);
  if ((int)p < 0) {
    uVar1 = 0;
    uStack_58 = 0;
    uStack_54 = (uint)uStack_54._1_3_ << 8;
  }
  else {
    this_00 = (this->inst_).ptr_._M_t.
              super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
              super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
              super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl + p;
    uStack_58 = p * 2;
    out = a.begin;
    if (nongreedy) {
      Prog::Inst::InitAlt(this_00,0,out);
    }
    else {
      Prog::Inst::InitAlt(this_00,out,0);
      uStack_58 = uStack_58 | 1;
    }
    PatchList::Patch((this->inst_).ptr_._M_t.
                     super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                     ._M_t.
                     super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                     .super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl,a.end,p);
    uStack_54 = CONCAT31(uStack_54._1_3_,a.nullable) & 0xffffff01;
    uVar1 = CONCAT44(uStack_58,out);
  }
  FVar2._12_4_ = uStack_54;
  FVar2.end.tail = uStack_58;
  FVar2.begin = (int)uVar1;
  FVar2.end.head = (int)((ulong)uVar1 >> 0x20);
  return FVar2;
}

Assistant:

Frag Compiler::Plus(Frag a, bool nongreedy) {
  int id = AllocInst(1);
  if (id < 0)
    return NoMatch();
  PatchList pl;
  if (nongreedy) {
    inst_[id].InitAlt(0, a.begin);
    pl = PatchList::Mk(id << 1);
  } else {
    inst_[id].InitAlt(a.begin, 0);
    pl = PatchList::Mk((id << 1) | 1);
  }
  PatchList::Patch(inst_.data(), a.end, id);
  return Frag(a.begin, pl, a.nullable);
}